

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t
psa_cipher_setup(psa_cipher_operation_t *operation,psa_key_handle_t handle,psa_algorithm_t alg,
                mbedtls_operation_t cipher_operation)

{
  anon_union_96_2_59bd0580_for_ctx *ctx;
  ushort uVar1;
  mbedtls_rsa_context *pmVar2;
  uint8_t uVar3;
  psa_status_t pVar4;
  int ret;
  mbedtls_cipher_info_t *cipher_info;
  mbedtls_cipher_padding_t mode;
  uchar *key;
  uint key_bitlen;
  psa_key_slot_t *slot;
  uint8_t keys [24];
  psa_key_slot_t *local_50;
  undefined8 local_48;
  size_t sStack_40;
  undefined8 local_38;
  
  if (operation->alg != 0) {
    return -0x89;
  }
  if ((alg & 0x7f000000) != 0x4000000) {
    (operation->ctx).cipher.iv_size = 0;
    (operation->ctx).cipher.cipher_ctx = (void *)0x0;
    *(undefined8 *)((long)&operation->ctx + 0x38) = 0;
    *(undefined8 *)((long)&operation->ctx + 0x40) = 0;
    *(undefined8 *)((long)&operation->ctx + 0x28) = 0;
    (operation->ctx).cipher.unprocessed_len = 0;
    (operation->ctx).cipher.get_padding = (_func_int_uchar_ptr_size_t_size_t_ptr *)0x0;
    *(undefined8 *)((long)&operation->ctx + 0x20) = 0;
    *(undefined8 *)((long)&operation->ctx + 8) = 0;
    (operation->ctx).cipher.add_padding = (_func_void_uchar_ptr_size_t_size_t *)0x0;
    operation->alg = 0;
    operation->field_0x4 = 0;
    operation->iv_size = '\0';
    operation->block_size = '\0';
    operation->field_0x7 = 0;
    (operation->ctx).cipher.cipher_info = (mbedtls_cipher_info_t *)0x0;
    (operation->ctx).cipher.cmac_ctx = (mbedtls_cmac_context_t *)0x0;
    return -0x87;
  }
  operation->alg = alg;
  operation->field_0x4 = operation->field_0x4 & 0xf8 | 2;
  operation->iv_size = '\0';
  operation->block_size = '\0';
  ctx = &operation->ctx;
  mbedtls_cipher_init(&ctx->cipher);
  pVar4 = psa_get_key_from_slot
                    (handle,&local_50,(uint)(cipher_operation != MBEDTLS_ENCRYPT) * 0x100 + 0x100,
                     alg);
  if (pVar4 != 0) goto LAB_00112fe1;
  uVar1 = (local_50->attr).bits;
  cipher_info = mbedtls_cipher_info_from_psa
                          (alg,(local_50->attr).type,(ulong)uVar1,(mbedtls_cipher_id_t *)0x0);
  if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
    pVar4 = -0x86;
    goto LAB_00112fe1;
  }
  ret = mbedtls_cipher_setup(&ctx->cipher,cipher_info);
  if (ret == 0) {
    key_bitlen = (uint)uVar1;
    if ((key_bitlen == 0x80) && ((local_50->attr).type == 0x2301)) {
      pmVar2 = (local_50->data).rsa;
      local_48 = *(undefined8 *)pmVar2;
      sStack_40 = pmVar2->len;
      key = (uchar *)&local_48;
      local_38 = *(undefined8 *)pmVar2;
      key_bitlen = 0xc0;
    }
    else {
      key = (local_50->data).raw.data;
    }
    ret = mbedtls_cipher_setkey(&ctx->cipher,key,key_bitlen,cipher_operation);
    if (ret == 0) {
      if (alg == 0x4600100) {
        mode = MBEDTLS_PADDING_NONE;
LAB_001130d6:
        ret = mbedtls_cipher_set_padding_mode(&ctx->cipher,mode);
        if (ret != 0) goto LAB_00113155;
      }
      else if (alg == 0x4600101) {
        mode = MBEDTLS_PADDING_PKCS7;
        goto LAB_001130d6;
      }
      operation->field_0x4 = operation->field_0x4 | 1;
      uVar3 = '\x01';
      if ((~alg & 0x4800000) != 0) {
        uVar1 = (local_50->attr).type;
        if ((uVar1 & 0x7000) == 0x2000) {
          uVar3 = (uint8_t)(1 << ((byte)(uVar1 >> 8) & 7));
        }
        else {
          uVar3 = '\0';
        }
      }
      operation->block_size = uVar3;
      if ((alg >> 0x16 & 1) == 0) {
        ret = 0;
        uVar3 = '\f';
        if (alg != 0x4800005) goto LAB_00113155;
      }
      else {
        uVar1 = (local_50->attr).type;
        uVar3 = '\0';
        if ((uVar1 & 0x7000) == 0x2000) {
          uVar3 = (uint8_t)(1 << ((byte)(uVar1 >> 8) & 7));
        }
      }
      operation->iv_size = uVar3;
      ret = 0;
    }
  }
LAB_00113155:
  pVar4 = mbedtls_to_psa_error(ret);
  if (pVar4 == 0) {
    return 0;
  }
LAB_00112fe1:
  psa_cipher_abort(operation);
  return pVar4;
}

Assistant:

static psa_status_t psa_cipher_setup( psa_cipher_operation_t *operation,
                                      psa_key_handle_t handle,
                                      psa_algorithm_t alg,
                                      mbedtls_operation_t cipher_operation )
{
    int ret = 0;
    psa_status_t status = PSA_ERROR_GENERIC_ERROR;
    psa_key_slot_t *slot;
    size_t key_bits;
    const mbedtls_cipher_info_t *cipher_info = NULL;
    psa_key_usage_t usage = ( cipher_operation == MBEDTLS_ENCRYPT ?
                              PSA_KEY_USAGE_ENCRYPT :
                              PSA_KEY_USAGE_DECRYPT );

    /* A context must be freshly initialized before it can be set up. */
    if( operation->alg != 0 )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    status = psa_cipher_init( operation, alg );
    if( status != PSA_SUCCESS )
        return( status );

    status = psa_get_transparent_key( handle, &slot, usage, alg);
    if( status != PSA_SUCCESS )
        goto exit;
    key_bits = psa_get_key_slot_bits( slot );

    cipher_info = mbedtls_cipher_info_from_psa( alg, slot->attr.type, key_bits, NULL );
    if( cipher_info == NULL )
    {
        status = PSA_ERROR_NOT_SUPPORTED;
        goto exit;
    }

    ret = mbedtls_cipher_setup( &operation->ctx.cipher, cipher_info );
    if( ret != 0 )
        goto exit;

#if defined(MBEDTLS_DES_C)
    if( slot->attr.type == PSA_KEY_TYPE_DES && key_bits == 128 )
    {
        /* Two-key Triple-DES is 3-key Triple-DES with K1=K3 */
        uint8_t keys[24];
        memcpy( keys, slot->data.raw.data, 16 );
        memcpy( keys + 16, slot->data.raw.data, 8 );
        ret = mbedtls_cipher_setkey( &operation->ctx.cipher,
                                     keys,
                                     192, cipher_operation );
    }
    else
#endif
    {
        ret = mbedtls_cipher_setkey( &operation->ctx.cipher,
                                     slot->data.raw.data,
                                     (int) key_bits, cipher_operation );
    }
    if( ret != 0 )
        goto exit;

#if defined(MBEDTLS_CIPHER_MODE_WITH_PADDING)
    switch( alg )
    {
        case PSA_ALG_CBC_NO_PADDING:
            ret = mbedtls_cipher_set_padding_mode( &operation->ctx.cipher,
                                                   MBEDTLS_PADDING_NONE );
            break;
        case PSA_ALG_CBC_PKCS7:
            ret = mbedtls_cipher_set_padding_mode( &operation->ctx.cipher,
                                                   MBEDTLS_PADDING_PKCS7 );
            break;
        default:
            /* The algorithm doesn't involve padding. */
            ret = 0;
            break;
    }
    if( ret != 0 )
        goto exit;
#endif //MBEDTLS_CIPHER_MODE_WITH_PADDING

    operation->key_set = 1;
    operation->block_size = ( PSA_ALG_IS_STREAM_CIPHER( alg ) ? 1 :
                              PSA_BLOCK_CIPHER_BLOCK_SIZE( slot->attr.type ) );
    if( alg & PSA_ALG_CIPHER_FROM_BLOCK_FLAG )
    {
        operation->iv_size = PSA_BLOCK_CIPHER_BLOCK_SIZE( slot->attr.type );
    }
#if defined(MBEDTLS_CHACHA20_C)
    else
    if( alg == PSA_ALG_CHACHA20 )
        operation->iv_size = 12;
#endif

exit:
    if( status == 0 )
        status = mbedtls_to_psa_error( ret );
    if( status != 0 )
        psa_cipher_abort( operation );
    return( status );
}